

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaReadAig.c
# Opt level: O0

Aig_Man_t * Ioa_ReadAigerFromMemory(char *pContents,int nFileSize,int fCheck)

{
  char cVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  char *pcVar8;
  bool bVar9;
  uint uLit;
  uint uLit1;
  uint uLit0;
  char *pCur;
  char *pSymbols;
  char *pDrivers;
  int nFair;
  int nJust;
  int nConstr;
  int nBad;
  int i;
  int nAnds;
  int nLatches;
  int nOutputs;
  int nInputs;
  int nTotal;
  Aig_Man_t *pNew;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode0;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vDrivers;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vLits;
  int fCheck_local;
  int nFileSize_local;
  char *pContents_local;
  
  vNodes = (Vec_Ptr_t *)0x0;
  nJust = 0;
  nFair = 0;
  pDrivers._4_4_ = 0;
  pDrivers._0_4_ = 0;
  vLits._0_4_ = fCheck;
  vLits._4_4_ = nFileSize;
  _fCheck_local = pContents;
  iVar3 = strncmp(pContents,"aig",3);
  if ((iVar3 == 0) && ((_fCheck_local[3] == ' ' || (_fCheck_local[3] == '2')))) {
    for (_uLit1 = _fCheck_local; *_uLit1 != ' '; _uLit1 = _uLit1 + 1) {
    }
    _uLit1 = _uLit1 + 1;
    nOutputs = atoi(_uLit1);
    for (; *_uLit1 != ' '; _uLit1 = _uLit1 + 1) {
    }
    _uLit1 = _uLit1 + 1;
    nLatches = atoi(_uLit1);
    for (; *_uLit1 != ' '; _uLit1 = _uLit1 + 1) {
    }
    _uLit1 = _uLit1 + 1;
    i = atoi(_uLit1);
    for (; *_uLit1 != ' '; _uLit1 = _uLit1 + 1) {
    }
    _uLit1 = _uLit1 + 1;
    nAnds = atoi(_uLit1);
    for (; *_uLit1 != ' '; _uLit1 = _uLit1 + 1) {
    }
    _uLit1 = _uLit1 + 1;
    nBad = atoi(_uLit1);
    while( true ) {
      bVar9 = false;
      if (*_uLit1 != ' ') {
        bVar9 = *_uLit1 != '\n';
      }
      if (!bVar9) break;
      _uLit1 = _uLit1 + 1;
    }
    if (*_uLit1 == ' ') {
      if (nAnds != 0) {
        __assert_fail("nOutputs == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                      ,0x89,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
      }
      _uLit1 = _uLit1 + 1;
      nJust = atoi(_uLit1);
      while( true ) {
        bVar9 = false;
        if (*_uLit1 != ' ') {
          bVar9 = *_uLit1 != '\n';
        }
        if (!bVar9) break;
        _uLit1 = _uLit1 + 1;
      }
      nAnds = nJust + nAnds;
    }
    if (*_uLit1 == ' ') {
      _uLit1 = _uLit1 + 1;
      nFair = atoi(_uLit1);
      while( true ) {
        bVar9 = false;
        if (*_uLit1 != ' ') {
          bVar9 = *_uLit1 != '\n';
        }
        if (!bVar9) break;
        _uLit1 = _uLit1 + 1;
      }
      nAnds = nFair + nAnds;
    }
    if (*_uLit1 == ' ') {
      _uLit1 = _uLit1 + 1;
      pDrivers._4_4_ = atoi(_uLit1);
      while( true ) {
        bVar9 = false;
        if (*_uLit1 != ' ') {
          bVar9 = *_uLit1 != '\n';
        }
        if (!bVar9) break;
        _uLit1 = _uLit1 + 1;
      }
      nAnds = pDrivers._4_4_ + nAnds;
    }
    if (*_uLit1 == ' ') {
      _uLit1 = _uLit1 + 1;
      pDrivers._0_4_ = atoi(_uLit1);
      while( true ) {
        bVar9 = false;
        if (*_uLit1 != ' ') {
          bVar9 = *_uLit1 != '\n';
        }
        if (!bVar9) break;
        _uLit1 = _uLit1 + 1;
      }
      nAnds = (int)pDrivers + nAnds;
    }
    if (*_uLit1 == '\n') {
      _uLit1 = _uLit1 + 1;
      if (nOutputs == nLatches + i + nBad) {
        if ((pDrivers._4_4_ == 0) && ((int)pDrivers == 0)) {
          if (nFair != 0) {
            if (nFair == 1) {
              fprintf(_stdout,"Warning: The last output is interpreted as a constraint.\n");
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",
                      (ulong)(uint)nFair);
            }
          }
          _nInputs = Aig_ManStart(nBad);
          _nInputs->nConstrs = nFair;
          pVVar6 = Vec_PtrAlloc(nLatches + 1 + i + nBad);
          vDrivers = pVVar6;
          pAVar7 = Aig_ManConst0(_nInputs);
          Vec_PtrPush(pVVar6,pAVar7);
          for (nConstr = 0; nConstr < nLatches + i; nConstr = nConstr + 1) {
            pNode0 = Aig_ObjCreateCi(_nInputs);
            Vec_PtrPush(vDrivers,pNode0);
          }
          _nInputs->nRegs = i;
          pSymbols = _uLit1;
          if (_fCheck_local[3] == ' ') {
            nConstr = 0;
            while (nConstr < i + nAnds) {
              pcVar8 = _uLit1 + 1;
              cVar1 = *_uLit1;
              _uLit1 = pcVar8;
              if (cVar1 == '\n') {
                nConstr = nConstr + 1;
              }
            }
          }
          else {
            vNodes = (Vec_Ptr_t *)Ioa_WriteDecodeLiterals((char **)&uLit1,i + nAnds);
          }
          for (nConstr = 0; nConstr < nBad; nConstr = nConstr + 1) {
            iVar3 = nConstr + 1 + nLatches + i;
            uVar4 = Ioa_ReadAigerDecode((char **)&uLit1);
            uVar4 = iVar3 * 2 - uVar4;
            uVar5 = Ioa_ReadAigerDecode((char **)&uLit1);
            pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vDrivers,uVar4 - uVar5 >> 1);
            pNode1 = Aig_NotCond(pAVar7,uVar4 - uVar5 & 1);
            pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vDrivers,uVar4 >> 1);
            pNew = (Aig_Man_t *)Aig_NotCond(pAVar7,uVar4 & 1);
            iVar3 = Vec_PtrSize(vDrivers);
            pVVar6 = vDrivers;
            if (iVar3 != nConstr + 1 + nLatches + i) {
              __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                            ,0x100,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
            }
            pAVar7 = Aig_And(_nInputs,pNode1,(Aig_Obj_t *)pNew);
            Vec_PtrPush(pVVar6,pAVar7);
          }
          pCur = _uLit1;
          pObj = (Aig_Obj_t *)Vec_PtrAlloc(i + nAnds);
          if (_fCheck_local[3] == ' ') {
            _uLit1 = pSymbols;
            for (nConstr = 0; nConstr < i; nConstr = nConstr + 1) {
              uVar4 = atoi(_uLit1);
              do {
                pcVar8 = _uLit1 + 1;
                cVar1 = *_uLit1;
                _uLit1 = pcVar8;
              } while (cVar1 != '\n');
              pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vDrivers,uVar4 >> 1);
              pNode1 = Aig_NotCond(pAVar7,uVar4 & 1);
              Vec_PtrPush((Vec_Ptr_t *)pObj,pNode1);
            }
            for (nConstr = 0; nConstr < nAnds; nConstr = nConstr + 1) {
              uVar4 = atoi(_uLit1);
              do {
                pcVar8 = _uLit1 + 1;
                cVar1 = *_uLit1;
                _uLit1 = pcVar8;
              } while (cVar1 != '\n');
              pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vDrivers,uVar4 >> 1);
              pNode1 = Aig_NotCond(pAVar7,uVar4 & 1);
              Vec_PtrPush((Vec_Ptr_t *)pObj,pNode1);
            }
          }
          else {
            for (nConstr = 0; nConstr < i; nConstr = nConstr + 1) {
              uVar4 = Vec_IntEntry((Vec_Int_t *)vNodes,nConstr);
              pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vDrivers,uVar4 >> 1);
              pNode1 = Aig_NotCond(pAVar7,uVar4 & 1);
              Vec_PtrPush((Vec_Ptr_t *)pObj,pNode1);
            }
            for (nConstr = 0; nConstr < nAnds; nConstr = nConstr + 1) {
              uVar4 = Vec_IntEntry((Vec_Int_t *)vNodes,nConstr + i);
              pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vDrivers,uVar4 >> 1);
              pNode1 = Aig_NotCond(pAVar7,uVar4 & 1);
              Vec_PtrPush((Vec_Ptr_t *)pObj,pNode1);
            }
            Vec_IntFree((Vec_Int_t *)vNodes);
          }
          for (nConstr = 0; pAVar2 = _nInputs, nConstr < nAnds; nConstr = nConstr + 1) {
            pAVar7 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,i + nConstr);
            Aig_ObjCreateCo(pAVar2,pAVar7);
          }
          for (nConstr = 0; pAVar2 = _nInputs, nConstr < i; nConstr = nConstr + 1) {
            pAVar7 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,nConstr);
            Aig_ObjCreateCo(pAVar2,pAVar7);
          }
          Vec_PtrFree((Vec_Ptr_t *)pObj);
          _uLit1 = pCur;
          if (((pCur + 1 < _fCheck_local + vLits._4_4_) && (*pCur == 'c')) &&
             (_uLit1 = pCur + 1, *_uLit1 == 'n')) {
            _uLit1 = pCur + 2;
            if (_nInputs->pName != (char *)0x0) {
              free(_nInputs->pName);
              _nInputs->pName = (char *)0x0;
            }
            pcVar8 = Abc_UtilStrsav(_uLit1);
            _nInputs->pName = pcVar8;
          }
          Vec_PtrFree(vDrivers);
          Aig_ManCleanup(_nInputs);
          pAVar2 = _nInputs;
          iVar3 = Aig_ManRegNum(_nInputs);
          Aig_ManSetRegNum(pAVar2,iVar3);
          if (((nJust != 0) || (nFair != 0)) || ((pDrivers._4_4_ != 0 || ((int)pDrivers != 0)))) {
            Aig_ManInvertConstraints(_nInputs);
          }
          if (((int)vLits == 0) || (iVar3 = Aig_ManCheck(_nInputs), iVar3 != 0)) {
            pContents_local = (char *)_nInputs;
          }
          else {
            printf("Ioa_ReadAiger: The network check has failed.\n");
            Aig_ManStop(_nInputs);
            pContents_local = (char *)0x0;
          }
        }
        else {
          fprintf(_stdout,
                  "Reading AIGER files with liveness properties are currently not supported.\n");
          pContents_local = (char *)0x0;
        }
      }
      else {
        fprintf(_stdout,"The number of objects does not match.\n");
        pContents_local = (char *)0x0;
      }
    }
    else {
      fprintf(_stdout,"The parameter line is in a wrong format.\n");
      pContents_local = (char *)0x0;
    }
  }
  else {
    fprintf(_stdout,"Wrong input file format.\n");
    pContents_local = (char *)0x0;
  }
  return (Aig_Man_t *)pContents_local;
}

Assistant:

Aig_Man_t * Ioa_ReadAigerFromMemory( char * pContents, int nFileSize, int fCheck )
{
    Vec_Int_t * vLits = NULL;
    Vec_Ptr_t * vNodes, * vDrivers;//, * vTerms;
    Aig_Obj_t * pObj, * pNode0, * pNode1;
    Aig_Man_t * pNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds, i;//, iTerm, nDigits;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    char * pDrivers, * pSymbols, * pCur;//, * pType;
    unsigned uLit0, uLit1, uLit;

    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties are currently not supported.\n" );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNew = Aig_ManStart( nAnds );
    pNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Aig_ManConst0(pNew) );

    // create the PIs
    for ( i = 0; i < nInputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCi(pNew);    
        Vec_PtrPush( vNodes, pObj );
    }
/*
    // create the POs
    for ( i = 0; i < nOutputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCo(pNew);   
    }
*/
    // create the latches
    pNew->nRegs = nLatches;
/*
    nDigits = Ioa_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Aig_ObjCreateLatch(pNew);
        Aig_LatchSetInit0( pObj );
        pNode0 = Aig_ObjCreateBi(pNew);
        pNode1 = Aig_ObjCreateBo(pNew);
        Aig_ObjAddFanin( pObj, pNode0 );
        Aig_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Aig_ObjAssignName( pObj, Aig_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Aig_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
*/ 

    // remember the beginning of latch/PO literals
    pDrivers = pCur;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    {
        vLits = Ioa_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
//    pProgress = Bar_ProgressStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Ioa_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Ioa_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Aig_And(pNew, pNode0, pNode1) );
    }
//    Bar_ProgressStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    vDrivers = Vec_PtrAlloc( nLatches + nOutputs );
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        pCur = pDrivers;
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }

    }
    else
    {
        // read the latch driver literals
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i+nLatches );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        Vec_IntFree( vLits );
    }

    // create the POs
    for ( i = 0; i < nOutputs; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, nLatches + i) );
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, i) );
    Vec_PtrFree( vDrivers );

/*
    // read the names if present
    pCur = pSymbols;
    if ( *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNew->vBoxes;
            else if ( *pCur == 'o' )
                vTerms = pNew->vPos;
            else
            {
                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Aig_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Aig_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
                Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Aig_Obj_t *)Aig_ObjName(pObj);
        } 

        // assign the remaining names
        Aig_ManForEachCi( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        Aig_ManForEachLatchOutput( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
            Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            Counter++;
        }
        Aig_ManForEachCo( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        if ( Counter )
            printf( "Ioa_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Ioa_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Aig_ManShortNames( pNew );
    }
*/
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            ABC_FREE( pNew->pName );
            pNew->pName = Abc_UtilStrsav( pCur );
        }
    }

    // skipping the comments
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pNew) );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Aig_ManInvertConstraints( pNew );

    // check the result
    if ( fCheck && !Aig_ManCheck( pNew ) )
    {
        printf( "Ioa_ReadAiger: The network check has failed.\n" );
        Aig_ManStop( pNew );
        return NULL;
    }
    return pNew;
}